

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Str_t * Gia_WritePacking(Vec_Int_t *vPacking)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  char *pcVar11;
  Vec_Str_t *pVVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  lVar15 = (long)vPacking->nSize;
  pcVar11 = (char *)malloc(lVar15 * 4);
  if (0 < lVar15) {
    piVar2 = vPacking->pArray;
    lVar13 = 0;
    do {
      uVar1 = piVar2[lVar13];
      uVar8 = (ushort)(uVar1 >> 0x10) & 0xff;
      uVar9 = (ushort)(uVar1 >> 8) & 0xff;
      uVar10 = (ushort)uVar1 & 0xff;
      bVar3 = (byte)(uVar1 >> 0x18);
      uVar7 = (ushort)bVar3;
      bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar3 - (0xff < uVar7);
      bVar4 = ((uVar1 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar1 >> 0x10) - (0xff < uVar8);
      bVar5 = ((uVar1 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar1 >> 8) - (0xff < uVar9);
      bVar6 = ((uVar1 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar1 - (0xff < uVar10);
      *(uint *)(pcVar11 + lVar13 * 4) =
           CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                    CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                             CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                      (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))));
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  pVVar12 = (Vec_Str_t *)malloc(0x10);
  iVar14 = (int)(lVar15 * 4);
  pVVar12->nSize = iVar14;
  pVVar12->nCap = iVar14;
  pVVar12->pArray = pcVar11;
  return pVVar12;
}

Assistant:

Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(vPacking) );
    int i, Entry, nSize = 0;
    Vec_IntForEachEntry( vPacking, Entry, i )
        Gia_AigerWriteInt( pBuffer + 4 * nSize++, Entry );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(vPacking) );
}